

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
wallet::anon_unknown_5::WalletImpl::handleTransactionChanged
          (WalletImpl *this,TransactionChangedFn fn)

{
  undefined8 uVar1;
  function<void_(const_uint256_&,_ChangeType)> *this_00;
  function<void_(const_uint256_&,_ChangeType)> *in_RDX;
  weak_count extraout_RDX;
  long in_RSI;
  long in_FS_OFFSET;
  connection connection;
  _Any_data _Stack_198;
  code *local_188;
  vector<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
  local_178;
  function2<void,_const_uint256_&,_ChangeType> fStack_160;
  undefined1 local_138 [32];
  code *local_118;
  _Any_data local_108;
  code *local_f8;
  function2<void,_const_uint256_&,_ChangeType> local_e8;
  _Any_data local_c8;
  code *local_b8;
  _Any_data local_a8;
  code *local_98;
  _Any_data local_88;
  code *local_78;
  _Any_data local_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)(in_RSI + 0x10);
  _GLOBAL__N_1::std::function<void_(const_uint256_&,_ChangeType)>::function
            ((function<void_(const_uint256_&,_ChangeType)> *)&_Stack_198,in_RDX);
  local_178.
  super__Vector_base<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fStack_160.super_function_base.vtable = (vtable_base *)0x0;
  local_178.
  super__Vector_base<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _GLOBAL__N_1::std::function<void_(const_uint256_&,_ChangeType)>::function
            ((function<void_(const_uint256_&,_ChangeType)> *)(local_138 + 0x10),
             (function<void_(const_uint256_&,_ChangeType)> *)&_Stack_198);
  _GLOBAL__N_1::std::function<void_(const_uint256_&,_ChangeType)>::function
            ((function<void_(const_uint256_&,_ChangeType)> *)&local_108,
             (function<void_(const_uint256_&,_ChangeType)> *)(local_138 + 0x10));
  _GLOBAL__N_1::std::function<void_(const_uint256_&,_ChangeType)>::function
            ((function<void_(const_uint256_&,_ChangeType)> *)&local_c8,
             (function<void_(const_uint256_&,_ChangeType)> *)&local_108);
  local_e8.super_function_base.vtable = (vtable_base *)0x0;
  _GLOBAL__N_1::std::function<void_(const_uint256_&,_ChangeType)>::function
            ((function<void_(const_uint256_&,_ChangeType)> *)&local_a8,
             (function<void_(const_uint256_&,_ChangeType)> *)&local_c8);
  _GLOBAL__N_1::std::function<void_(const_uint256_&,_ChangeType)>::function
            ((function<void_(const_uint256_&,_ChangeType)> *)&local_88,
             (function<void_(const_uint256_&,_ChangeType)> *)&local_a8);
  _GLOBAL__N_1::std::function<void_(const_uint256_&,_ChangeType)>::function
            ((function<void_(const_uint256_&,_ChangeType)> *)&local_68,
             (function<void_(const_uint256_&,_ChangeType)> *)&local_88);
  _GLOBAL__N_1::std::function<void_(const_uint256_&,_ChangeType)>::function
            ((function<void_(const_uint256_&,_ChangeType)> *)&local_48,
             (function<void_(const_uint256_&,_ChangeType)> *)&local_68);
  this_00 = (function<void_(const_uint256_&,_ChangeType)> *)operator_new(0x20);
  _GLOBAL__N_1::std::function<void_(const_uint256_&,_ChangeType)>::function
            (this_00,(function<void_(const_uint256_&,_ChangeType)> *)&local_48);
  local_e8.super_function_base.functor.members._0_8_ = (undefined8)this_00;
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  local_e8.super_function_base.vtable =
       (vtable_base *)
       boost::function2<void,uint256_const&,ChangeType>::
       assign_to<wallet::(anonymous_namespace)::WalletImpl::handleTransactionChanged(std::function<void(uint256_const&,ChangeType)>)::{lambda(uint256_const&,ChangeType)#1}>(wallet::(anonymous_namespace)::WalletImpl::handleTransactionChanged(std::function<void(uint256_const&,ChangeType)>)::{lambda(uint256_const&,ChangeType)#1})
       ::stored_vtable;
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  boost::function2<void,_const_uint256_&,_ChangeType>::swap(&local_e8,&fStack_160);
  boost::function2<void,_const_uint256_&,_ChangeType>::~function2(&local_e8);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_118 != (code *)0x0) {
    (*local_118)((_Any_data *)(local_138 + 0x10),(_Any_data *)(local_138 + 0x10),__destroy_functor);
  }
  boost::signals2::
  signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
  ::connect((signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
             *)local_138,(int)uVar1 + 0x430,(sockaddr *)&local_178,0);
  connection._weak_connection_body.pn.pi_ = extraout_RDX.pi_;
  connection._weak_connection_body.px = (element_type *)local_138;
  interfaces::MakeSignalHandler((interfaces *)this,connection);
  boost::detail::weak_count::~weak_count((weak_count *)(local_138 + 8));
  boost::function2<void,_const_uint256_&,_ChangeType>::~function2(&fStack_160);
  std::
  vector<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>,_std::allocator<boost::variant<boost::weak_ptr<boost::signals2::detail::trackable_pointee>,_boost::weak_ptr<void>,_boost::signals2::detail::foreign_void_weak_ptr>_>_>
  ::~vector(&local_178);
  if (local_188 != (code *)0x0) {
    (*local_188)(&_Stack_198,&_Stack_198,__destroy_functor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleTransactionChanged(TransactionChangedFn fn) override
    {
        return MakeSignalHandler(m_wallet->NotifyTransactionChanged.connect(
            [fn](const uint256& txid, ChangeType status) { fn(txid, status); }));
    }